

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O1

void __thiscall QPDFArgParser::handleArgFileArguments(QPDFArgParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  char *pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  size_t sVar8;
  element_type *peVar9;
  pointer psVar10;
  ulong uVar11;
  long lVar12;
  ulong i;
  ulong uVar13;
  allocator<char> local_79;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  string local_68;
  shared_ptr<const_char> local_40;
  
  peVar9 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,*peVar9->argv,&local_79);
  QUtil::make_shared_cstr((QUtil *)&local_78,&local_68);
  local_40.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78;
  local_40.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Stack_70
  ;
  local_78 = (element_type *)0x0;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>>::
  emplace_back<std::shared_ptr<char_const>>
            ((vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>> *)
             &peVar9->new_argv,&local_40);
  if (local_40.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
  }
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  peVar9 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (1 < peVar9->argc) {
    lVar12 = 1;
    do {
      pcVar2 = peVar9->argv[lVar12];
      sVar8 = strlen(pcVar2);
      if ((sVar8 < 2) || (*pcVar2 != '@')) {
LAB_0015e668:
        peVar9 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,peVar9->argv[lVar12],&local_79);
        QUtil::make_shared_cstr((QUtil *)&local_78,&local_68);
        local_40.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78;
        local_40.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Stack_70;
        local_78 = (element_type *)0x0;
        p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>>::
        emplace_back<std::shared_ptr<char_const>>
                  ((vector<std::shared_ptr<char_const>,std::allocator<std::shared_ptr<char_const>>>
                    *)&peVar9->new_argv,&local_40);
        if (local_40.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
        }
        if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar1) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        iVar7 = strcmp(pcVar2 + 1,"-");
        if ((iVar7 != 0) && (bVar6 = QUtil::file_can_be_opened(pcVar2 + 1), !bVar6))
        goto LAB_0015e668;
        pcVar3 = ((this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->argv[lVar12];
        pcVar2 = pcVar3 + 1;
        local_68._M_dataplus._M_p = (pointer)paVar1;
        sVar8 = strlen(pcVar2);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,pcVar2,pcVar3 + sVar8 + 1);
        readArgsFromFile(this,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar1) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      lVar12 = lVar12 + 1;
      peVar9 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    } while (lVar12 < peVar9->argc);
  }
  lVar12 = (long)*(pointer *)
                  ((long)&(peVar9->new_argv).
                          super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
                          ._M_impl.super__Vector_impl_data + 8) -
           (long)(peVar9->new_argv).
                 super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4;
  local_68._M_dataplus._M_p =
       (pointer)operator_new__(-(ulong)(lVar12 + 1U >> 0x3d != 0) | lVar12 * 8 + 8U);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<char_const**,std::default_delete<char_const*[]>,std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_string_length);
  sVar5 = local_68._M_string_length;
  _Var4._M_p = local_68._M_dataplus._M_p;
  peVar9 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68._M_dataplus._M_p = (pointer)0x0;
  local_68._M_string_length = 0;
  this_00 = (peVar9->argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (peVar9->argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var4._M_p;
  (peVar9->argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
  }
  peVar9 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar10 = (peVar9->new_argv).
            super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&(peVar9->new_argv).
               super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
               ._M_impl.super__Vector_impl_data + 8) == psVar10) {
    i = 0;
    uVar13 = 0;
  }
  else {
    lVar12 = 0;
    uVar11 = 0;
    do {
      (peVar9->argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr[uVar11]
           = *(element_type *)
              ((long)&(psVar10->super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
              lVar12);
      uVar11 = uVar11 + 1;
      peVar9 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      psVar10 = (peVar9->new_argv).
                super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = (long)*(pointer *)
                      ((long)&(peVar9->new_argv).
                              super__Vector_base<std::shared_ptr<const_char>,_std::allocator<std::shared_ptr<const_char>_>_>
                              ._M_impl.super__Vector_impl_data + 8) - (long)psVar10;
      i = (long)uVar13 >> 4;
      lVar12 = lVar12 + 0x10;
    } while (uVar11 < i);
  }
  if (i >> 0x1f != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i);
  }
  peVar9 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar9->argc = (int)i;
  (peVar9->argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  [(int)(uVar13 >> 4)] = (element_type)0x0;
  peVar9 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar9->argv = (peVar9->argv_ph).super___shared_ptr<const_char_*,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  return;
}

Assistant:

void
QPDFArgParser::handleArgFileArguments()
{
    // Support reading arguments from files. Create a new argv. Ensure that argv itself as well as
    // all its contents are automatically deleted by using shared pointers back to the pointers in
    // argv.
    m->new_argv.push_back(QUtil::make_shared_cstr(m->argv[0]));
    for (int i = 1; i < m->argc; ++i) {
        char const* argfile = nullptr;
        if ((strlen(m->argv[i]) > 1) && (m->argv[i][0] == '@')) {
            argfile = 1 + m->argv[i];
            if (strcmp(argfile, "-") != 0) {
                if (!QUtil::file_can_be_opened(argfile)) {
                    // The file's not there; treating as regular option
                    argfile = nullptr;
                }
            }
        }
        if (argfile) {
            readArgsFromFile(1 + m->argv[i]);
        } else {
            m->new_argv.push_back(QUtil::make_shared_cstr(m->argv[i]));
        }
    }
    m->argv_ph = QUtil::make_shared_array<char const*>(1 + m->new_argv.size());
    for (size_t i = 0; i < m->new_argv.size(); ++i) {
        m->argv_ph.get()[i] = m->new_argv.at(i).get();
    }
    m->argc = QIntC::to_int(m->new_argv.size());
    m->argv_ph.get()[m->argc] = nullptr;
    m->argv = m->argv_ph.get();
}